

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void upb_Message_Freeze(upb_Message *msg,upb_MiniTable *m)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  upb_MiniTableField *puVar5;
  upb_Map *map;
  upb_MiniTableExtension *puVar6;
  upb_Array *puVar7;
  ulong in_RAX;
  upb_Extension *puVar8;
  ulong uVar9;
  uint uVar10;
  upb_MessageValue *puVar11;
  upb_MiniTable *puVar12;
  byte bVar13;
  ulong uVar14;
  upb_Message *msg_00;
  long lVar15;
  size_t ext_count;
  ulong local_38;
  
  if (((msg->field_0).internal_opaque & 1) == 0) {
    (msg->field_0).internal_opaque = (msg->field_0).internal_opaque | 1;
    uVar3 = m->field_count_dont_copy_me__upb_internal_use_only;
    local_38 = in_RAX;
    if (uVar3 != 0) {
      lVar15 = 0;
      do {
        puVar5 = m->fields_dont_copy_me__upb_internal_use_only;
        bVar1 = (&puVar5->descriptortype_dont_copy_me__upb_internal_use_only)[lVar15];
        bVar2 = (&puVar5->mode_dont_copy_me__upb_internal_use_only)[lVar15];
        uVar10 = (uint)bVar1;
        if ((bVar2 & 0x10) == 0) {
          if ((ulong)(bVar1 - 1) - 9 < 2) {
            puVar12 = *m->subs_dont_copy_me__upb_internal_use_only
                       [*(ushort *)
                         ((long)&puVar5->submsg_index_dont_copy_me__upb_internal_use_only + lVar15)]
                       .submsg_dont_copy_me__upb_internal_use_only;
          }
          else {
LAB_0011115c:
            puVar12 = (upb_MiniTable *)0x0;
          }
        }
        else {
          if (bVar1 == 5) goto LAB_0011115c;
          puVar12 = (upb_MiniTable *)0x0;
          if (uVar10 != 0xc) goto LAB_00111554;
        }
        bVar13 = bVar2 & 3;
        switch(bVar13) {
        case 0:
          if (bVar2 < 0xc0) {
            __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_NativePointer"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/field.h"
                          ,0xcc,
                          "void _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (bVar13 != 0) {
            __assert_fail("upb_MiniTableField_IsMap(f)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/field.h"
                          ,0xcd,
                          "void _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (*(short *)((long)&puVar5->presence + lVar15) != 0) {
            __assert_fail("f->presence == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/field.h"
                          ,0xce,
                          "void _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if ((bVar2 & 8) != 0) {
LAB_001113f4:
            __assert_fail("!upb_MiniTableField_IsExtension(field)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/internal/accessors.h"
                          ,0x10d,
                          "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                         );
          }
          map = *(upb_Map **)
                 ((long)&msg->field_0 +
                 (ulong)*(ushort *)
                         ((long)&puVar5->offset_dont_copy_me__upb_internal_use_only + lVar15));
          if (((ulong)map & 1) != 0) {
            __assert_fail("!upb_TaggedMessagePtr_IsEmpty(tagged)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/internal/accessors.h"
                          ,0x1ac,
                          "void _upb_Message_AssertMapIsUntagged_dont_copy_me__upb_internal_use_only(const struct upb_Message *, const upb_MiniTableField *)"
                         );
          }
          if (map != (upb_Map *)0x0) {
            if (puVar12->field_count_dont_copy_me__upb_internal_use_only != 2) {
              __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/message.h"
                            ,0xa5,
                            "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                           );
            }
            puVar5 = puVar12->fields_dont_copy_me__upb_internal_use_only;
            if (puVar5[1].number_dont_copy_me__upb_internal_use_only != 2) {
              __assert_fail("upb_MiniTableField_Number(f) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/message.h"
                            ,0xa7,
                            "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                           );
            }
            bVar1 = puVar5[1].descriptortype_dont_copy_me__upb_internal_use_only;
            if ((puVar5[1].mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
              if ((ulong)(bVar1 - 1) - 9 < 2) {
                puVar12 = *puVar12->subs_dont_copy_me__upb_internal_use_only
                           [puVar5[1].submsg_index_dont_copy_me__upb_internal_use_only].
                           submsg_dont_copy_me__upb_internal_use_only;
              }
              else {
LAB_001112e6:
                puVar12 = (upb_MiniTable *)0x0;
              }
            }
            else {
              if (bVar1 == 5) goto LAB_001112e6;
              puVar12 = (upb_MiniTable *)0x0;
              if (bVar1 != 0xc) goto LAB_00111554;
            }
            upb_Map_Freeze(map,puVar12);
          }
          break;
        case 1:
          if (bVar2 < 0xc0) {
            __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_NativePointer"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/field.h"
                          ,0xc4,
                          "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (bVar13 != 1) {
            __assert_fail("upb_MiniTableField_IsArray(f)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/field.h"
                          ,0xc5,
                          "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (*(short *)((long)&puVar5->presence + lVar15) != 0) {
            __assert_fail("f->presence == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/field.h"
                          ,0xc6,
                          "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if ((bVar2 & 8) != 0) goto LAB_001113f4;
          puVar7 = *(upb_Array **)
                    ((long)&msg->field_0 +
                    (ulong)*(ushort *)
                            ((long)&puVar5->offset_dont_copy_me__upb_internal_use_only + lVar15));
          if (puVar7 != (upb_Array *)0x0) {
            upb_Array_Freeze(puVar7,puVar12);
          }
          break;
        case 2:
          if (puVar12 != (upb_MiniTable *)0x0) {
            if ((bVar2 & 0x10) != 0) {
              if ((bVar1 == 5) || (uVar10 == 0xc)) {
LAB_00111535:
                __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/internal/accessors.h"
                              ,0x1bd,
                              "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                             );
              }
              goto LAB_00111554;
            }
            if (1 < (ulong)(uVar10 - 1) - 9) goto LAB_00111535;
            if (bVar2 >> 6 != 3) {
              __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/internal/accessors.h"
                            ,0x1bf,
                            "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                           );
            }
            if (bVar13 != 2) {
              __assert_fail("upb_MiniTableField_IsScalar(f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/internal/accessors.h"
                            ,0x1c0,
                            "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                           );
            }
            if ((bVar2 & 8) != 0) goto LAB_001113f4;
            uVar4 = *(ushort *)((long)&puVar5->presence + lVar15);
            if ((short)uVar4 < 0) {
              uVar10 = 0;
              uVar9 = 0;
              uVar14 = 0;
              if (*(int *)((long)&msg->field_0 + (ulong)(ushort)~uVar4) ==
                  *(int *)((long)&puVar5->number_dont_copy_me__upb_internal_use_only + lVar15))
              goto LAB_001112b1;
            }
            else {
LAB_001112b1:
              uVar9 = *(ulong *)((long)&msg->field_0 +
                                (ulong)*(ushort *)
                                        ((long)&puVar5->offset_dont_copy_me__upb_internal_use_only +
                                        lVar15));
              uVar10 = (uint)uVar9 & 0xffffff00;
              uVar14 = uVar9 >> 0x20;
            }
            if ((uVar9 & 1) != 0) {
              __assert_fail("!upb_TaggedMessagePtr_IsEmpty(ptr)",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/internal/tagged_ptr.h"
                            ,0x28,
                            "struct upb_Message *upb_TaggedMessagePtr_GetNonEmptyMessage(uintptr_t)"
                           );
            }
            msg_00 = (upb_Message *)(uVar14 << 0x20 | (ulong)((uint)uVar9 & 0xff | uVar10));
            if (msg_00 != (upb_Message *)0x0) {
              upb_Message_Freeze(msg_00,puVar12);
            }
          }
        }
        lVar15 = lVar15 + 0xc;
      } while ((ulong)uVar3 * 0xc != lVar15);
    }
    puVar8 = _upb_Message_Getexts_dont_copy_me__upb_internal_use_only(msg,&local_38);
    if (local_38 != 0) {
      puVar11 = &puVar8->data;
      uVar9 = 0;
      do {
        puVar6 = ((upb_Extension *)((long)puVar11 + -8))->ext;
        bVar1 = (puVar6->field_dont_copy_me__upb_internal_use_only).
                descriptortype_dont_copy_me__upb_internal_use_only;
        bVar2 = (puVar6->field_dont_copy_me__upb_internal_use_only).
                mode_dont_copy_me__upb_internal_use_only;
        if ((bVar2 & 0x10) == 0) {
          if ((ulong)(bVar1 - 1) - 9 < 2) {
            puVar12 = (puVar6->sub_dont_copy_me__upb_internal_use_only).
                      submsg_dont_copy_me__upb_internal_use_only;
          }
          else {
LAB_001113ab:
            puVar12 = (upb_MiniTable *)0x0;
          }
        }
        else {
          if (bVar1 == 5) goto LAB_001113ab;
          puVar12 = (upb_MiniTable *)0x0;
          if (bVar1 != 0xc) {
LAB_00111554:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/field.h"
                          ,0x7b,
                          "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                         );
          }
        }
        puVar7 = puVar11->array_val;
        switch(bVar2 & 3) {
        case 0:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/message.c"
                        ,0x93,"void upb_Message_Freeze(upb_Message *, const upb_MiniTable *)");
        case 1:
          if (puVar7 != (upb_Array *)0x0) {
            upb_Array_Freeze(puVar7,puVar12);
          }
          break;
        case 2:
          if (((bVar1 & 0xfe) == 10) && (puVar7 != (upb_Array *)0x0)) {
            upb_Message_Freeze((upb_Message *)puVar7,puVar12);
          }
        }
        uVar9 = uVar9 + 1;
        puVar11 = (upb_MessageValue *)((long)puVar11 + 0x18);
      } while (uVar9 < local_38);
    }
  }
  return;
}

Assistant:

void upb_Message_Freeze(upb_Message* msg, const upb_MiniTable* m) {
  if (upb_Message_IsFrozen(msg)) return;
  UPB_PRIVATE(_upb_Message_ShallowFreeze)(msg);

  // Base Fields.
  const size_t field_count = upb_MiniTable_FieldCount(m);

  for (size_t i = 0; i < field_count; i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    const upb_MiniTable* m2 = upb_MiniTable_SubMessage(m, f);

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = upb_Message_GetMutableArray(msg, f);
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map: {
        upb_Map* map = upb_Message_GetMutableMap(msg, f);
        if (map) {
          const upb_MiniTableField* f2 = upb_MiniTable_MapValue(m2);
          const upb_MiniTable* m3 = upb_MiniTable_SubMessage(m2, f2);
          upb_Map_Freeze(map, m3);
        }
        break;
      }
      case kUpb_FieldMode_Scalar: {
        if (m2) {
          upb_Message* msg2 = upb_Message_GetMutableMessage(msg, f);
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
      }
    }
  }

  // Extensions.
  size_t ext_count;
  const upb_Extension* ext = UPB_PRIVATE(_upb_Message_Getexts)(msg, &ext_count);

  for (size_t i = 0; i < ext_count; i++) {
    const upb_MiniTableExtension* e = ext[i].ext;
    const upb_MiniTableField* f = &e->UPB_PRIVATE(field);
    const upb_MiniTable* m2 = upb_MiniTableExtension_GetSubMessage(e);

    upb_MessageValue val;
    memcpy(&val, &ext[i].data, sizeof(upb_MessageValue));

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = (upb_Array*)val.array_val;
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map:
        UPB_UNREACHABLE();  // Maps cannot be extensions.
        break;
      case kUpb_FieldMode_Scalar:
        if (upb_MiniTableField_IsSubMessage(f)) {
          upb_Message* msg2 = (upb_Message*)val.msg_val;
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
    }
  }
}